

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O2

ostream * std::operator<<(ostream *os,quath *v)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"(");
  operator<<(poVar1,&v->real);
  poVar1 = std::operator<<(poVar1,", ");
  operator<<(poVar1,(half *)v);
  poVar1 = std::operator<<(poVar1,", ");
  operator<<(poVar1,(v->imag)._M_elems + 1);
  poVar1 = std::operator<<(poVar1,", ");
  operator<<(poVar1,(v->imag)._M_elems + 2);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::quath &v) {
  os << "(" << v.real << ", " << v.imag[0] << ", " << v.imag[1] << ", "
     << v.imag[2] << ")";
  return os;
}